

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_setup_connection(Curl_easy *data,connectdata *conn)

{
  FILEPROTO *pFVar1;
  RTSP *rtsp;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pFVar1 = (FILEPROTO *)(*Curl_ccalloc)(1,0x10);
  (data->req).p.file = pFVar1;
  if (pFVar1 == (FILEPROTO *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_dyn_init((dynbuf *)&(conn->proto).ftpc,1000000);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode rtsp_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  struct RTSP *rtsp;
  (void)conn;

  data->req.p.rtsp = rtsp = calloc(1, sizeof(struct RTSP));
  if(!rtsp)
    return CURLE_OUT_OF_MEMORY;

  Curl_dyn_init(&conn->proto.rtspc.buf, MAX_RTP_BUFFERSIZE);
  return CURLE_OK;
}